

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 __p;
  ssize_t extraout_RAX;
  undefined1 local_58 [16];
  io_task task;
  
  task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  task.offset_ = 0;
  task.len_ = 0;
  task.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  task.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  task.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)0x0
  ;
  std::make_shared<Liby::Buffer,Liby::Buffer>((Buffer *)local_58);
  std::__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  if (*(long *)((long)__buf + 0x10) != 0) {
    std::make_unique<std::function<void()>,std::function<void()>const&>
              ((function<void_()> *)local_58);
    __p = local_58._0_8_;
    local_58._0_8_ = (element_type *)0x0;
    std::__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    reset((__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
          &task.handler_,(pointer)__p);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )local_58);
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,&task);
  enableWrit(this,true);
  io_task::~io_task(&task);
  return extraout_RAX;
}

Assistant:

void Connection::send(Buffer &&buf, const BasicHandler &handler) {
    io_task task;
    task.buffer_ = std::make_shared<Buffer>(std::move(buf));
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}